

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam-core.c
# Opt level: O1

la_proto_node * la_miam_core_v2_ack_parse(uint8_t *hdrbuf,int hdrlen,uint8_t *bodybuf,int bodylen)

{
  void *pvVar1;
  la_proto_node *plVar2;
  
  pvVar1 = la_xcalloc(1,0x68,
                      "/workspace/llm4binary/github/license_c_cmakelists/szpajder[P]libacars/libacars/miam-core.c"
                      ,0x405,"la_miam_core_v2_ack_parse");
  plVar2 = la_proto_node_new();
  plVar2->td = &la_DEF_miam_core_v2_ack_pdu;
  plVar2->data = pvVar1;
  plVar2->next = (la_proto_node *)0x0;
  if (hdrlen < 8) {
    *(byte *)((long)pvVar1 + 8) = *(byte *)((long)pvVar1 + 8) | 8;
  }
  else {
    *(uint8_t *)((long)pvVar1 + 0x10) = hdrbuf[1] >> 1;
    *(byte *)((long)pvVar1 + 0x11) = (hdrbuf[1] & 1) << 3 | hdrbuf[2] >> 5;
    *(undefined2 *)((long)pvVar1 + 0x12) = *(undefined2 *)(hdrbuf + 4);
  }
  return plVar2;
}

Assistant:

static la_proto_node *la_miam_core_v2_ack_parse(uint8_t const *hdrbuf, int hdrlen, uint8_t const *bodybuf, int bodylen) {
	la_assert(hdrbuf != NULL);
	LA_UNUSED(bodybuf);
	LA_UNUSED(bodylen);

	LA_NEW(la_miam_core_v2_ack_pdu, pdu);
	la_proto_node *node = la_proto_node_new();
	node->td = &la_DEF_miam_core_v2_ack_pdu;
	node->data = pdu;
	node->next = NULL;

	if(hdrlen < 8) {
		la_debug_print(D_ERROR, "Header too short: %d < 8\n", hdrlen);
		pdu->err |= LA_MIAM_ERR_HDR_TRUNCATED;
		goto end;
	}

	hdrbuf++; hdrlen--;

	pdu->msg_ack_num = (hdrbuf[0] >> 1) & 0x7f;
	pdu->ack_xfer_result = ((hdrbuf[0] << 3) | (hdrbuf[1] >> 5)) & 0xf;
	la_debug_print(D_INFO, "msg_ack_num: %u ack_xfer_result: 0x%x\n", pdu->msg_ack_num, pdu->ack_xfer_result);
	hdrbuf += 3; hdrlen -= 3;

	memcpy(pdu->crc, hdrbuf, LA_MIAM_CORE_V2_CRC_LEN);
	hdrbuf += LA_MIAM_CORE_V2_CRC_LEN; hdrlen -= LA_MIAM_CORE_V2_CRC_LEN;

	hdrbuf += 2; hdrlen -= 2;       // jump over 2 spare octets
	if(hdrlen > 0) {
		la_debug_print(D_INFO, "Warning: %u bytes left after MIAM header\n", hdrlen);
	}
end:
	return node;
}